

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

void __thiscall iqnet::Socket::Socket(Socket *this)

{
  int __fd;
  network_error *this_00;
  allocator<char> local_41;
  int enable;
  
  this->_vptr_Socket = (_func_int **)&PTR__Socket_0019e5c8;
  (this->peer)._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_0019be08;
  (this->peer).impl_.px = (element_type *)0x0;
  (this->peer).impl_.pn.pi_ = (sp_counted_base *)0x0;
  __fd = socket(2,1,6);
  this->sock = __fd;
  if (__fd != -1) {
    enable = 1;
    setsockopt(__fd,1,2,&enable,4);
    return;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&enable,"Socket::Socket",&local_41);
  network_error::network_error(this_00,(string *)&enable,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Socket::Socket()
{
  if( (sock = socket( PF_INET, SOCK_STREAM, IPPROTO_TCP )) == -1 )
    throw network_error( "Socket::Socket" );

#ifndef WIN32
  {
  int enable = 1;
  setsockopt( sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(enable) );
  }
#endif //WIN32

#if defined(__APPLE__)
  {
  int enable = 1;
  setsockopt( sock, SOL_SOCKET, SO_NOSIGPIPE, &enable, sizeof(enable) );
  }
#endif
}